

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Oric.cpp
# Opt level: O0

void __thiscall
Oric::ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)3,_(CPU::MOS6502Esque::Type)1>
::~ConcreteMachine(ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)3,_(CPU::MOS6502Esque::Type)1>
                   *this)

{
  ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)3,_(CPU::MOS6502Esque::Type)1>
  *this_local;
  
  (this->super_TimedMachine)._vptr_TimedMachine = (_func_int **)&PTR_run_for_00ca56e0;
  (this->super_ScanProducer)._vptr_ScanProducer = (_func_int **)&PTR_set_scan_target_00ca57d8;
  (this->super_AudioProducer)._vptr_AudioProducer = (_func_int **)&DAT_00ca5810;
  (this->super_JoystickMachine)._vptr_JoystickMachine = (_func_int **)&DAT_00ca5828;
  (this->super_MediaTarget)._vptr_MediaTarget = (_func_int **)&DAT_00ca5840;
  (this->super_MappedKeyboardMachine).super_Delegate._vptr_Delegate = (_func_int **)&DAT_00ca5858;
  (this->super_MappedKeyboardMachine).super_KeyboardMachine.super_KeyActions._vptr_KeyActions =
       (_func_int **)&PTR_set_key_state_00ca5888;
  (this->super_Device)._vptr_Device = (_func_int **)&PTR_set_options_00ca58c8;
  (this->super_Delegate)._vptr_Delegate = (_func_int **)&DAT_00ca58e8;
  (this->super_Delegate)._vptr_Delegate = (_func_int **)&DAT_00ca5900;
  (this->super_Delegate).super_Delegate._vptr_Delegate =
       (_func_int **)&PTR_wd1770_did_change_output_00ca5918;
  (this->super_Source)._vptr_Source = (_func_int **)&DAT_00ca5938;
  (this->super_Machine)._vptr_Machine = (_func_int **)&PTR__ConcreteMachine_00ca5950;
  (this->super_SpecialKeyHandler)._vptr_SpecialKeyHandler = (_func_int **)&DAT_00ca5970;
  Concurrency::AsyncTaskQueue<false,_true,_void>::flush(&this->audio_queue_);
  std::unique_ptr<Utility::StringSerialiser,_std::default_delete<Utility::StringSerialiser>_>::
  ~unique_ptr(&this->string_serialiser_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&this->pravetz_rom_);
  JustInTimeActor<Apple::DiskII,_Cycles,_1,_1>::~JustInTimeActor(&this->diskii_);
  BD500::~BD500(&this->bd500_);
  Jasmin::~Jasmin(&this->jasmin_);
  Microdisc::~Microdisc(&this->microdisc_);
  VIAPortHandler::~VIAPortHandler(&this->via_port_handler_);
  TapePlayer::~TapePlayer(&this->tape_player_);
  Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>::~PullLowpass(&this->speaker_);
  Concurrency::AsyncTaskQueue<false,_true,_void>::~AsyncTaskQueue(&this->audio_queue_);
  JustInTimeActor<Oric::VideoOutput,_Cycles,_1,_1>::~JustInTimeActor(&this->video_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&this->disk_rom_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&this->rom_);
  Oric::Machine::~Machine(&this->super_Machine);
  MachineTypes::MappedKeyboardMachine::~MappedKeyboardMachine(&this->super_MappedKeyboardMachine);
  return;
}

Assistant:

~ConcreteMachine() {
			audio_queue_.flush();
		}